

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void mi_stats_merge_from(mi_stats_t *stats)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  
  if (stats != &_mi_stats_main) {
    lVar3 = (stats->pages).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages.total = _mi_stats_main.pages.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages.current = _mi_stats_main.pages.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages.peak = _mi_stats_main.pages.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reserved).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reserved.total = _mi_stats_main.reserved.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reserved).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reserved.current = _mi_stats_main.reserved.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reserved).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reserved.peak = _mi_stats_main.reserved.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->committed).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.committed.total = _mi_stats_main.committed.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->committed).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.committed.current = _mi_stats_main.committed.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->committed).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.committed.peak = _mi_stats_main.committed.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reset).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reset.total = _mi_stats_main.reset.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reset).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reset.current = _mi_stats_main.reset.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reset).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reset.peak = _mi_stats_main.reset.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->purged).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.purged.total = _mi_stats_main.purged.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->purged).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.purged.current = _mi_stats_main.purged.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->purged).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.purged.peak = _mi_stats_main.purged.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->page_committed).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.page_committed.total = _mi_stats_main.page_committed.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->page_committed).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.page_committed.current = _mi_stats_main.page_committed.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->page_committed).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.page_committed.peak = _mi_stats_main.page_committed.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_abandoned).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_abandoned.total = _mi_stats_main.pages_abandoned.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_abandoned).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_abandoned.current = _mi_stats_main.pages_abandoned.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_abandoned).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_abandoned.peak = _mi_stats_main.pages_abandoned.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->threads).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.threads.total = _mi_stats_main.threads.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->threads).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.threads.current = _mi_stats_main.threads.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->threads).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.threads.peak = _mi_stats_main.threads.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_normal).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_normal.total = _mi_stats_main.malloc_normal.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_normal).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_normal.current = _mi_stats_main.malloc_normal.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_normal).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_normal.peak = _mi_stats_main.malloc_normal.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_huge).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_huge.total = _mi_stats_main.malloc_huge.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_huge).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_huge.current = _mi_stats_main.malloc_huge.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_huge).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_huge.peak = _mi_stats_main.malloc_huge.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_requested).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_requested.total = _mi_stats_main.malloc_requested.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_requested).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_requested.current = _mi_stats_main.malloc_requested.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_requested).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_requested.peak = _mi_stats_main.malloc_requested.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->mmap_calls).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.mmap_calls.total = _mi_stats_main.mmap_calls.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->commit_calls).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.commit_calls.total = _mi_stats_main.commit_calls.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->reset_calls).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.reset_calls.total = _mi_stats_main.reset_calls.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->purge_calls).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.purge_calls.total = _mi_stats_main.purge_calls.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->arena_count).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.arena_count.total = _mi_stats_main.arena_count.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_normal_count).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_normal_count.total = _mi_stats_main.malloc_normal_count.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_huge_count).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_huge_count.total = _mi_stats_main.malloc_huge_count.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->malloc_guarded_count).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.malloc_guarded_count.total = _mi_stats_main.malloc_guarded_count.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->arena_rollback_count).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.arena_rollback_count.total = _mi_stats_main.arena_rollback_count.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->arena_purges).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.arena_purges.total = _mi_stats_main.arena_purges.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_extended).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_extended.total = _mi_stats_main.pages_extended.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_retire).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_retire.total = _mi_stats_main.pages_retire.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->page_searches).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.page_searches.total = _mi_stats_main.page_searches.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments.total = _mi_stats_main.segments.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments.current = _mi_stats_main.segments.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments.peak = _mi_stats_main.segments.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_abandoned).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_abandoned.total = _mi_stats_main.segments_abandoned.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_abandoned).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_abandoned.current = _mi_stats_main.segments_abandoned.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_abandoned).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_abandoned.peak = _mi_stats_main.segments_abandoned.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_cache).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_cache.total = _mi_stats_main.segments_cache.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_cache).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_cache.current = _mi_stats_main.segments_cache.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->segments_cache).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.segments_cache.peak = _mi_stats_main.segments_cache.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->_segments_reserved).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main._segments_reserved.total = _mi_stats_main._segments_reserved.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->_segments_reserved).current;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main._segments_reserved.current = _mi_stats_main._segments_reserved.current + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->_segments_reserved).peak;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main._segments_reserved.peak = _mi_stats_main._segments_reserved.peak + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_reclaim_on_alloc).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_reclaim_on_alloc.total =
           _mi_stats_main.pages_reclaim_on_alloc.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_reclaim_on_free).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_reclaim_on_free.total =
           _mi_stats_main.pages_reclaim_on_free.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_reabandon_full).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_reabandon_full.total = _mi_stats_main.pages_reabandon_full.total + lVar3;
      UNLOCK();
    }
    lVar3 = (stats->pages_unabandon_busy_wait).total;
    if (lVar3 != 0) {
      LOCK();
      _mi_stats_main.pages_unabandon_busy_wait.total =
           _mi_stats_main.pages_unabandon_busy_wait.total + lVar3;
      UNLOCK();
    }
    lVar3 = 0x978;
    do {
      lVar2 = *(long *)((long)stats + lVar3 + -0x10);
      if (lVar2 != 0) {
        LOCK();
        *(long *)(lVar3 + 0x6bd8f0) = *(long *)(lVar3 + 0x6bd8f0) + lVar2;
        UNLOCK();
      }
      lVar2 = *(long *)((long)&stats->version + lVar3);
      if (lVar2 != 0) {
        LOCK();
        plVar1 = (long *)((long)&_mi_stats_main.version + lVar3);
        *plVar1 = *plVar1 + lVar2;
        UNLOCK();
      }
      lVar2 = *(long *)((long)stats + lVar3 + -8);
      if (lVar2 != 0) {
        LOCK();
        *(long *)(lVar3 + 0x6bd8f8) = *(long *)(lVar3 + 0x6bd8f8) + lVar2;
        UNLOCK();
      }
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x1068);
    memset(stats,0,0x1058);
    return;
  }
  return;
}

Assistant:

static void mi_stats_merge_from(mi_stats_t* stats) {
  if (stats != &_mi_stats_main) {
    mi_stats_add(&_mi_stats_main, stats);
    memset(stats, 0, sizeof(mi_stats_t));
  }
}